

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

void gf2RedPentanomial(word *a,size_t n,gf2_pentanom_st *p)

{
  ulong uVar1;
  long lVar2;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  word hi;
  gf2_pentanom_st *p_local;
  size_t n_local;
  word *a_local;
  
  n_local = n << 1;
  while (n_local = n_local - 1, p->wm < n_local) {
    uVar1 = a[n_local];
    if (p->bm == 0) {
      local_28 = 0;
    }
    else {
      local_28 = uVar1 << (0x40U - (char)p->bm & 0x3f);
    }
    lVar2 = (n_local - p->wm) + -1;
    a[lVar2] = local_28 ^ a[lVar2];
    lVar2 = n_local - p->wm;
    a[lVar2] = uVar1 >> ((byte)p->bm & 0x3f) ^ a[lVar2];
    if (p->bl1 == 0) {
      local_30 = 0;
    }
    else {
      local_30 = uVar1 << (0x40U - (char)p->bl1 & 0x3f);
    }
    lVar2 = (n_local - p->wl1) + -1;
    a[lVar2] = local_30 ^ a[lVar2];
    lVar2 = n_local - p->wl1;
    a[lVar2] = uVar1 >> ((byte)p->bl1 & 0x3f) ^ a[lVar2];
    if (p->bl == 0) {
      local_38 = 0;
    }
    else {
      local_38 = uVar1 << (0x40U - (char)p->bl & 0x3f);
    }
    lVar2 = (n_local - p->wl) + -1;
    a[lVar2] = local_38 ^ a[lVar2];
    lVar2 = n_local - p->wl;
    a[lVar2] = uVar1 >> ((byte)p->bl & 0x3f) ^ a[lVar2];
    if (p->bk == 0) {
      local_40 = 0;
    }
    else {
      local_40 = uVar1 << (0x40U - (char)p->bk & 0x3f);
    }
    lVar2 = (n_local - p->wk) + -1;
    a[lVar2] = local_40 ^ a[lVar2];
    lVar2 = n_local - p->wk;
    a[lVar2] = uVar1 >> ((byte)p->bk & 0x3f) ^ a[lVar2];
  }
  uVar1 = a[n_local] >> ((byte)p->bm & 0x3f);
  *a = uVar1 ^ *a;
  uVar1 = uVar1 << ((byte)p->bm & 0x3f);
  if ((p->wl1 < n_local) && (p->bl1 != 0)) {
    lVar2 = (n_local - p->wl1) + -1;
    a[lVar2] = uVar1 << (0x40U - (char)p->bl1 & 0x3f) ^ a[lVar2];
  }
  lVar2 = n_local - p->wl1;
  a[lVar2] = uVar1 >> ((byte)p->bl1 & 0x3f) ^ a[lVar2];
  if ((p->wl < n_local) && (p->bl != 0)) {
    lVar2 = (n_local - p->wl) + -1;
    a[lVar2] = uVar1 << (0x40U - (char)p->bl & 0x3f) ^ a[lVar2];
  }
  lVar2 = n_local - p->wl;
  a[lVar2] = uVar1 >> ((byte)p->bl & 0x3f) ^ a[lVar2];
  if ((p->wk < n_local) && (p->bk != 0)) {
    lVar2 = (n_local - p->wk) + -1;
    a[lVar2] = uVar1 << (0x40U - (char)p->bk & 0x3f) ^ a[lVar2];
  }
  lVar2 = n_local - p->wk;
  a[lVar2] = uVar1 >> ((byte)p->bk & 0x3f) ^ a[lVar2];
  a[n_local] = uVar1 ^ a[n_local];
  return;
}

Assistant:

static void gf2RedPentanomial(word a[], size_t n, const gf2_pentanom_st* p)
{
	register word hi;
	// pre
	ASSERT(wwIsValid(a, 2 * n));
	ASSERT(memIsValid(p, sizeof(*p)));
	ASSERT(p->m > p->k && p->k > p->l && p->l > p->l1 && p->l1 > 0);
	ASSERT(p->k < B_PER_W);
	ASSERT(p->m - p->k >= B_PER_W);
	ASSERT(p->bm < B_PER_W && p->bk < B_PER_W);
	ASSERT(p->bl < B_PER_W && p->bl1 < B_PER_W);
	ASSERT(p->m == B_PER_W * p->wm + p->bm);
	ASSERT(p->m == p->k + B_PER_W * p->wk + p->bk);
	ASSERT(p->m == p->l + B_PER_W * p->wl + p->bl);
	ASSERT(p->m == p->l1 + B_PER_W * p->wl1 + p->bl1);
	ASSERT(n == W_OF_B(p->m));
	// обрабатываем старшие слова
	n *= 2;
	while (--n > p->wm)
	{
		hi = a[n];
		a[n - p->wm - 1] ^= p->bm ? hi << (B_PER_W - p->bm) : 0;
		a[n - p->wm] ^= hi >> p->bm;
		a[n - p->wl1 - 1] ^= p->bl1 ? hi << (B_PER_W - p->bl1) : 0;
		a[n - p->wl1] ^= hi >> p->bl1;
		a[n - p->wl - 1] ^= p->bl ? hi << (B_PER_W - p->bl) : 0;
		a[n - p->wl] ^= hi >> p->bl;
		a[n - p->wk - 1] ^= p->bk ? hi << (B_PER_W - p->bk) : 0;
		a[n - p->wk] ^= hi >> p->bk;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == p->wm);
	hi = a[n] >> p->bm;
	a[0] ^= hi;
	hi <<= p->bm;
	if (p->wl1 < n && p->bl1)
		a[n - p->wl1 - 1] ^= hi << (B_PER_W - p->bl1);
	a[n - p->wl1] ^= hi >> p->bl1;
	if (p->wl < n && p->bl)
		a[n - p->wl - 1] ^= hi << (B_PER_W - p->bl);
	a[n - p->wl] ^= hi >> p->bl;
	if (p->wk < n && p->bk)
		a[n - p->wk - 1] ^= hi << (B_PER_W - p->bk);
	a[n - p->wk] ^= hi >> p->bk;
	a[n] ^= hi;
	// очистка
	hi = 0;
}